

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int print_dir_entry(mg_connection *conn,de *de)

{
  uint64_t uVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  tm *__tp;
  char *pcVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char *local_110;
  long local_f0;
  tm *tm;
  char mod [64];
  char size [64];
  char *local_50;
  char *p;
  char *esc;
  char *href;
  size_t i;
  size_t escsize;
  size_t namesize;
  de *de_local;
  mg_connection *conn_local;
  
  sVar2 = strlen(de->file_name);
  lVar3 = sVar2 + 1;
  pcVar4 = de->file_name;
  sVar2 = strcspn(de->file_name,"&<>");
  if (pcVar4[sVar2] == '\0') {
    local_f0 = 0;
  }
  else {
    local_f0 = lVar3 * 5;
  }
  pcVar4 = (char *)mg_malloc(lVar3 * 3 + local_f0);
  if (pcVar4 == (char *)0x0) {
    conn_local._4_4_ = -1;
  }
  else {
    mg_url_encode(de->file_name,pcVar4,lVar3 * 3);
    p = (char *)0x0;
    if (local_f0 != 0) {
      p = pcVar4 + lVar3 * 3;
      href = (char *)0x0;
      local_50 = p;
      while (href[(long)de->file_name] != '\0') {
        mg_strlcpy(local_50,href + (long)de->file_name,2);
        if (*local_50 == '&') {
          strcpy(local_50,"&amp;");
        }
        else if (*local_50 == '<') {
          strcpy(local_50,"&lt;");
        }
        else if (*local_50 == '>') {
          strcpy(local_50,"&gt;");
        }
        href = href + 1;
        sVar2 = strlen(local_50);
        local_50 = local_50 + sVar2;
      }
    }
    if ((de->file).is_directory == 0) {
      if ((de->file).size < 0x400) {
        mg_snprintf(conn,(int *)0x0,mod + 0x38,0x40,"%d",(de->file).size & 0xffffffff);
      }
      else if ((de->file).size < 0x100000) {
        uVar1 = (de->file).size;
        auVar7._8_4_ = (int)(uVar1 >> 0x20);
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        mg_snprintf(conn,(int *)0x0,mod + 0x38,0x40,"%.1fk",
                    ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1024.0);
      }
      else if ((de->file).size < 0x40000000) {
        uVar1 = (de->file).size;
        auVar8._8_4_ = (int)(uVar1 >> 0x20);
        auVar8._0_8_ = uVar1;
        auVar8._12_4_ = 0x45300000;
        mg_snprintf(conn,(int *)0x0,mod + 0x38,0x40,"%.1fM",
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1048576.0);
      }
      else {
        uVar1 = (de->file).size;
        auVar9._8_4_ = (int)(uVar1 >> 0x20);
        auVar9._0_8_ = uVar1;
        auVar9._12_4_ = 0x45300000;
        mg_snprintf(conn,(int *)0x0,mod + 0x38,0x40,"%.1fG",
                    ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1073741824.0);
      }
    }
    else {
      mg_snprintf(conn,(int *)0x0,mod + 0x38,0x40,"%s","[DIRECTORY]");
    }
    __tp = localtime(&(de->file).last_modified);
    if (__tp == (tm *)0x0) {
      mg_strlcpy((char *)&tm,"01-Jan-1970 00:00",0x40);
    }
    else {
      strftime((char *)&tm,0x40,"%d-%b-%Y %H:%M",__tp);
    }
    pcVar5 = "";
    if ((de->file).is_directory != 0) {
      pcVar5 = "/";
    }
    if (p == (char *)0x0) {
      local_110 = de->file_name;
    }
    else {
      local_110 = p;
    }
    pcVar6 = "";
    if ((de->file).is_directory != 0) {
      pcVar6 = "/";
    }
    mg_printf(conn,
              "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
              ,pcVar4,pcVar5,local_110,pcVar6,&tm,mod + 0x38);
    mg_free(pcVar4);
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

static int
print_dir_entry(struct mg_connection *conn, struct de *de)
{
	size_t namesize, escsize, i;
	char *href, *esc, *p;
	char size[64], mod[64];
#if defined(REENTRANT_TIME)
	struct tm _tm;
	struct tm *tm = &_tm;
#else
	struct tm *tm;
#endif

	/* Estimate worst case size for encoding and escaping */
	namesize = strlen(de->file_name) + 1;
	escsize = de->file_name[strcspn(de->file_name, "&<>")] ? namesize * 5 : 0;
	href = (char *)mg_malloc(namesize * 3 + escsize);
	if (href == NULL) {
		return -1;
	}
	mg_url_encode(de->file_name, href, namesize * 3);
	esc = NULL;
	if (escsize > 0) {
		/* HTML escaping needed */
		esc = href + namesize * 3;
		for (i = 0, p = esc; de->file_name[i]; i++, p += strlen(p)) {
			mg_strlcpy(p, de->file_name + i, 2);
			if (*p == '&') {
				strcpy(p, "&amp;");
			} else if (*p == '<') {
				strcpy(p, "&lt;");
			} else if (*p == '>') {
				strcpy(p, "&gt;");
			}
		}
	}

	if (de->file.is_directory) {
		mg_snprintf(conn,
		            NULL, /* Buffer is big enough */
		            size,
		            sizeof(size),
		            "%s",
		            "[DIRECTORY]");
	} else {
		/* We use (signed) cast below because MSVC 6 compiler cannot
		 * convert unsigned __int64 to double. Sigh. */
		if (de->file.size < 1024) {
			mg_snprintf(conn,
			            NULL, /* Buffer is big enough */
			            size,
			            sizeof(size),
			            "%d",
			            (int)de->file.size);
		} else if (de->file.size < 0x100000) {
			mg_snprintf(conn,
			            NULL, /* Buffer is big enough */
			            size,
			            sizeof(size),
			            "%.1fk",
			            (double)de->file.size / 1024.0);
		} else if (de->file.size < 0x40000000) {
			mg_snprintf(conn,
			            NULL, /* Buffer is big enough */
			            size,
			            sizeof(size),
			            "%.1fM",
			            (double)de->file.size / 1048576);
		} else {
			mg_snprintf(conn,
			            NULL, /* Buffer is big enough */
			            size,
			            sizeof(size),
			            "%.1fG",
			            (double)de->file.size / 1073741824);
		}
	}

	/* Note: mg_snprintf will not cause a buffer overflow above.
	 * So, string truncation checks are not required here. */

#if defined(REENTRANT_TIME)
	localtime_r(&de->file.last_modified, tm);
#else
	tm = localtime(&de->file.last_modified);
#endif
	if (tm != NULL) {
		strftime(mod, sizeof(mod), "%d-%b-%Y %H:%M", tm);
	} else {
		mg_strlcpy(mod, "01-Jan-1970 00:00", sizeof(mod));
	}
	mg_printf(conn,
	          "<tr><td><a href=\"%s%s\">%s%s</a></td>"
	          "<td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n",
	          href,
	          de->file.is_directory ? "/" : "",
	          esc ? esc : de->file_name,
	          de->file.is_directory ? "/" : "",
	          mod,
	          size);
	mg_free(href);
	return 0;
}